

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O0

int __thiscall menuwindow::is_inside(menuwindow *this,int mx,int my)

{
  int iVar1;
  int iVar2;
  int my_local;
  int mx_local;
  menuwindow *this_local;
  
  iVar1 = Fl_Window::x_root((Fl_Window *)this);
  if (iVar1 <= mx) {
    iVar1 = Fl_Window::x_root((Fl_Window *)this);
    iVar2 = Fl_Widget::w((Fl_Widget *)this);
    if ((mx < iVar1 + iVar2) && (iVar1 = Fl_Window::y_root((Fl_Window *)this), iVar1 <= my)) {
      iVar1 = Fl_Window::y_root((Fl_Window *)this);
      iVar2 = Fl_Widget::h((Fl_Widget *)this);
      if (my < iVar1 + iVar2) {
        if ((this->itemheight == 0) && (iVar1 = find_selected(this,mx,my), iVar1 == -1)) {
          return 0;
        }
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int menuwindow::is_inside(int mx, int my) {
  if ( mx < x_root() || mx >= x_root() + w() ||
       my < y_root() || my >= y_root() + h()) {
    return 0;
  }
  if (itemheight == 0 && find_selected(mx, my) == -1) {
    // in the menubar but out from any menu header
    return 0;
    }
  return 1;
}